

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::AnnotatedHandler::decode
          (AnnotatedHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  uint32_t uVar1;
  uint uVar2;
  WireValue<uint32_t>_conflict WVar3;
  Reader value;
  Reader value_00;
  WirePointer WVar4;
  WirePointer WVar5;
  Reader *pRVar6;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar7;
  Reader *pRVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  ListElementCount LVar12;
  Entry *pEVar13;
  HashBucket *pHVar14;
  bool bVar15;
  ushort uVar16;
  WirePointer WVar17;
  long lVar18;
  Reader *__begin3;
  WirePointer WVar19;
  size_t sVar20;
  ElementCount index;
  long lVar21;
  StringPtr SVar22;
  Reader field;
  Fault f;
  HashSet<const_void_*> unionsSeen;
  Vector<capnp::json::Value::Field::Reader> local_1c8;
  WirePointer local_1a8;
  WirePointer local_1a0;
  undefined1 local_198 [24];
  WirePointer WStack_180;
  StructDataBitCount local_178;
  ushort uStack_174;
  undefined2 uStack_172;
  WireValue<uint32_t>_conflict WStack_170;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aStack_16c;
  AnnotatedHandler *local_168;
  JsonCodec *local_160;
  ListReader local_158;
  WirePointer local_128;
  undefined8 uStack_120;
  WirePointer local_118;
  WirePointer local_110;
  undefined1 local_108 [16];
  Entry *local_f8;
  ArrayDisposer *local_f0;
  size_t local_e0;
  HashBucket *pHStack_d8;
  size_t local_d0;
  ArrayDisposer *pAStack_c8;
  PointerReader local_b8;
  StructReader local_90;
  StructReader local_60;
  
  local_168 = this;
  local_160 = codec;
  if ((input._reader.dataSize < 0x10) || (*input._reader.data != 5)) {
    local_158.segment = (SegmentReader *)0x0;
    local_108 = (undefined1  [16])0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_158,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_158);
  }
  local_108 = (undefined1  [16])0x0;
  WVar19.offsetAndKind.value = 0;
  WVar19.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  local_f8 = (Entry *)0x0;
  local_e0 = 0;
  pHStack_d8 = (HashBucket *)0x0;
  local_d0 = 0;
  pAStack_c8 = (ArrayDisposer *)0x0;
  local_1c8.builder.endPtr = (Reader *)0x0;
  local_1c8.builder.ptr = (Reader *)0x0;
  local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
  local_198._16_8_ = input._reader.pointers;
  if (input._reader.pointerCount == 0) {
    local_198._16_8_ = WVar19;
  }
  local_198._0_8_ = (SegmentReader *)0x0;
  local_198._8_8_ = (CapTableReader *)0x0;
  WVar3.value = 0x7fffffff;
  if (input._reader.pointerCount != 0) {
    local_198._0_8_ = input._reader.segment;
    local_198._8_8_ = input._reader.capTable;
    WVar3.value = input._reader.nestingLimit;
  }
  WStack_180.offsetAndKind.value = WVar3.value;
  capnp::_::PointerReader::getList
            (&local_158,(PointerReader *)local_198,INLINE_COMPOSITE,(word *)0x0);
  LVar12 = local_158.elementCount;
  if (local_158.elementCount != 0) {
    WVar17.offsetAndKind.value = 0;
    WVar17.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    index = 0;
    do {
      capnp::_::ListReader::getStructElement((StructReader *)local_198,&local_158,index);
      local_b8.nestingLimit = (int)WStack_170;
      local_b8.pointer = (WirePointer *)WStack_180;
      if (uStack_174 == 0) {
        local_b8.nestingLimit = 0x7fffffff;
        local_b8.pointer = (WirePointer *)WVar17;
      }
      local_b8.segment = (SegmentReader *)0x0;
      local_b8.capTable = (CapTableReader *)0x0;
      if (uStack_174 != 0) {
        local_b8.segment = (SegmentReader *)local_198._0_8_;
        local_b8.capTable = (CapTableReader *)local_198._8_8_;
      }
      SVar22.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>(&local_b8,(void *)0x0,0);
      local_b8.pointer = (WirePointer *)((long)WStack_180 + 8);
      if (uStack_174 < 2) {
        local_b8.segment = (SegmentReader *)0x0;
        local_b8.capTable = (CapTableReader *)0x0;
        local_b8.nestingLimit = 0x7fffffff;
        local_b8.pointer = (WirePointer *)WVar17;
      }
      else {
        local_b8.segment = (SegmentReader *)local_198._0_8_;
        local_b8.capTable = (CapTableReader *)local_198._8_8_;
        local_b8.nestingLimit = (int)WStack_170;
      }
      capnp::_::PointerReader::getStruct(&local_60,&local_b8,(word *)0x0);
      value._reader.capTable = local_60.capTable;
      value._reader.segment = local_60.segment;
      value._reader.data = local_60.data;
      value._reader.pointers = local_60.pointers;
      value._reader.dataSize = local_60.dataSize;
      value._reader.pointerCount = local_60.pointerCount;
      value._reader._38_2_ = local_60._38_2_;
      value._reader.nestingLimit = local_60.nestingLimit;
      value._reader._44_4_ = local_60._44_4_;
      bVar15 = decodeField(local_168,local_160,SVar22,value,output,
                           (HashSet<const_void_*> *)local_108);
      if (!bVar15) {
        if (local_1c8.builder.pos == local_1c8.builder.endPtr) {
          sVar20 = ((long)local_1c8.builder.pos - (long)local_1c8.builder.ptr >> 4) *
                   0x5555555555555556;
          if (local_1c8.builder.pos == local_1c8.builder.ptr) {
            sVar20 = 4;
          }
          kj::Vector<capnp::json::Value::Field::Reader>::setCapacity(&local_1c8,sVar20);
        }
        auVar10 = local_198._0_16_;
        WVar4.field_1.upper32Bits._0_2_ = uStack_174;
        WVar4.offsetAndKind.value = local_178;
        WVar4.field_1.structRef.ptrCount.value =
             (WireValue<WirePointerCount16>)(WireValue<WirePointerCount16>)uStack_172;
        WVar5.field_1.upper32Bits = aStack_16c.upper32Bits;
        WVar5.offsetAndKind.value = WStack_170.value;
        *(WirePointer *)((long)local_1c8.builder.pos + 0x20) = WVar4;
        *(WirePointer *)((long)local_1c8.builder.pos + 0x28) = WVar5;
        *(WireValue<uint32_t>_conflict *)&((local_1c8.builder.pos)->_reader).data =
             (WireValue<uint32_t>_conflict)local_198._16_4_;
        *(undefined4 *)((long)&((local_1c8.builder.pos)->_reader).data + 4) = local_198._20_4_;
        *(WirePointer *)((long)local_1c8.builder.pos + 0x18) = WStack_180;
        *(undefined8 *)local_1c8.builder.pos = local_198._0_8_;
        *(WireValue<uint32_t>_conflict *)&((local_1c8.builder.pos)->_reader).capTable =
             (WireValue<uint32_t>_conflict)local_198._8_4_;
        *(undefined4 *)((long)&((local_1c8.builder.pos)->_reader).capTable + 4) = local_198._12_4_;
        local_1c8.builder.pos =
             (RemoveConst<capnp::json::Value::Field::Reader> *)((long)local_1c8.builder.pos + 0x30);
        local_198._0_16_ = auVar10;
      }
      index = index + 1;
    } while (LVar12 != index);
  }
  do {
    pRVar7 = local_1c8.builder.pos;
    WVar19 = (WirePointer)local_1c8.builder.ptr;
    if (local_1c8.builder.pos == local_1c8.builder.ptr) break;
    local_198._8_8_ = local_1c8.builder.pos;
    local_198._0_8_ = local_1c8.builder.ptr;
    local_198._16_8_ = local_1c8.builder.endPtr;
    WStack_180 = (WirePointer)local_1c8.builder.disposer;
    local_1c8.builder.ptr = (Reader *)0x0;
    local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
    local_1c8.builder.endPtr = (Reader *)0x0;
    local_118 = (WirePointer)pRVar7;
    do {
      local_1a0 = *(WirePointer *)WVar19;
      WVar17 = *(WirePointer *)((long)WVar19 + 8);
      local_110 = *(WirePointer *)((long)WVar19 + 0x10);
      local_1a8 = *(WirePointer *)((long)WVar19 + 0x18);
      uVar1 = ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)WVar19 + 0x24))->upper32Bits;
      local_128 = *(WirePointer *)((long)WVar19 + 0x28);
      uVar16 = (ushort)uVar1;
      uStack_120 = 0;
      if (uVar16 == 0) {
        local_158.elementCount = 0x7fffffff;
        local_158.capTable._0_4_ = 0;
        local_158.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        local_158.ptr._0_4_ = 0;
        local_158.ptr._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        local_158.segment._0_4_ = 0;
        local_158.segment._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        local_158.elementCount = (ListElementCount)local_128.offsetAndKind.value;
        local_158.capTable = (CapTableReader *)WVar17;
        local_158.ptr = (byte *)local_1a8;
        local_158.segment = (SegmentReader *)local_1a0;
      }
      uVar2 = (((WirePointer *)((long)WVar19 + 0x20))->offsetAndKind).value;
      SVar22.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_158,(void *)0x0,0);
      if (uVar16 < 2) {
        local_158.elementCount = 0x7fffffff;
        local_158.capTable._0_4_ = 0;
        local_158.capTable._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        local_158.ptr = (byte *)0x0;
        local_158.segment._0_4_ = 0;
        local_158.segment._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        local_158.ptr = (byte *)((long)local_1a8 + 8);
        local_158.capTable = (CapTableReader *)WVar17;
        local_158.segment = (SegmentReader *)local_1a0;
        local_158.elementCount = local_128.offsetAndKind.value;
      }
      capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)&local_158,(word *)0x0);
      value_00._reader.capTable = local_90.capTable;
      value_00._reader.segment = local_90.segment;
      value_00._reader.data = local_90.data;
      value_00._reader.pointers = local_90.pointers;
      value_00._reader.dataSize = local_90.dataSize;
      value_00._reader.pointerCount = local_90.pointerCount;
      value_00._reader._38_2_ = local_90._38_2_;
      value_00._reader.nestingLimit = local_90.nestingLimit;
      value_00._reader._44_4_ = local_90._44_4_;
      bVar15 = decodeField(local_168,local_160,SVar22,value_00,output,
                           (HashSet<const_void_*> *)local_108);
      if (!bVar15) {
        if (local_1c8.builder.pos == local_1c8.builder.endPtr) {
          sVar20 = ((long)local_1c8.builder.pos - (long)local_1c8.builder.ptr >> 4) *
                   0x5555555555555556;
          if (local_1c8.builder.pos == local_1c8.builder.ptr) {
            sVar20 = 4;
          }
          kj::Vector<capnp::json::Value::Field::Reader>::setCapacity(&local_1c8,sVar20);
        }
        *(WirePointer *)local_1c8.builder.pos = local_1a0;
        *(WirePointer *)((long)local_1c8.builder.pos + 8) = WVar17;
        *(WirePointer *)((long)local_1c8.builder.pos + 0x10) = local_110;
        *(WirePointer *)((long)local_1c8.builder.pos + 0x18) = local_1a8;
        (((WirePointer *)((long)local_1c8.builder.pos + 0x20))->offsetAndKind).value = uVar2;
        ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_1c8.builder.pos + 0x24))->
        upper32Bits = uVar1;
        *(WirePointer *)((long)local_1c8.builder.pos + 0x28) = local_128;
        local_1c8.builder.pos =
             (RemoveConst<capnp::json::Value::Field::Reader> *)((long)local_1c8.builder.pos + 0x30);
      }
      uVar11 = local_198._16_8_;
      WVar19 = (WirePointer)((long)WVar19 + 0x30);
    } while (WVar19 != local_118);
    uVar9 = local_198._0_8_;
    lVar21 = (long)local_1c8.builder.pos - (long)local_1c8.builder.ptr;
    lVar18 = local_198._8_8_ - local_198._0_8_;
    if ((SegmentReader *)local_198._0_8_ != (SegmentReader *)0x0) {
      local_198._0_16_ = (undefined1  [16])0x0;
      local_198._16_4_ = 0;
      local_198._20_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      (*(code *)**(undefined8 **)WStack_180)
                (WStack_180,uVar9,0x30,(lVar18 >> 4) * -0x5555555555555555,
                 ((long)(uVar11 - uVar9) >> 4) * -0x5555555555555555,0);
    }
  } while (lVar21 != lVar18);
  pRVar8 = local_1c8.builder.endPtr;
  pRVar7 = local_1c8.builder.pos;
  pRVar6 = local_1c8.builder.ptr;
  if ((WirePointer)local_1c8.builder.ptr != (WirePointer)0x0) {
    local_1c8.builder.ptr = (Reader *)0x0;
    local_1c8.builder.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
    local_1c8.builder.endPtr = (Reader *)0x0;
    (*(code *)*(local_1c8.builder.disposer)->_vptr_ArrayDisposer)
              (local_1c8.builder.disposer,pRVar6,0x30,
               ((long)pRVar7 - (long)pRVar6 >> 4) * -0x5555555555555555,
               ((long)pRVar8 - (long)pRVar6 >> 4) * -0x5555555555555555,0);
  }
  sVar20 = local_d0;
  pHVar14 = pHStack_d8;
  if (pHStack_d8 != (HashBucket *)0x0) {
    pHStack_d8 = (HashBucket *)0x0;
    local_d0 = 0;
    (**pAStack_c8->_vptr_ArrayDisposer)(pAStack_c8,pHVar14,8,sVar20,sVar20,0);
  }
  pEVar13 = local_f8;
  uVar11 = local_108._0_8_;
  if ((Entry *)local_108._0_8_ != (Entry *)0x0) {
    uVar9 = local_108._8_8_;
    local_108 = (undefined1  [16])0x0;
    local_f8 = (Entry *)0x0;
    (**local_f0->_vptr_ArrayDisposer)
              (local_f0,uVar11,8,(long)(uVar9 - uVar11) >> 3,(long)pEVar13 - uVar11 >> 3,0);
  }
  return;
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    KJ_REQUIRE(input.isObject());
    kj::HashSet<const void*> unionsSeen;
    kj::Vector<JsonValue::Field::Reader> retries;
    for (auto field: input.getObject()) {
      if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
        retries.add(field);
      }
    }
    while (!retries.empty()) {
      auto retriesCopy = kj::mv(retries);
      KJ_ASSERT(retries.empty());
      for (auto field: retriesCopy) {
        if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
          retries.add(field);
        }
      }
      if (retries.size() == retriesCopy.size()) {
        // We made no progress in this iteration. Give up on the remaining fields.
        break;
      }
    }
  }